

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_icontainer(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  uint32_t *puVar2;
  
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_ext_ib_index = *puVar2;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_ext_ib_offset = *puVar2;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_ext_ib_size = *puVar2;
  pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 2);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

inline uint32_t xr_reader::r_u32() { return *m_p_u32++; }